

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_utils.hpp
# Opt level: O0

void duckdb::ThrowNumericCastError<char,_unsigned_long>(unsigned_long in,char minval,char maxval)

{
  undefined8 uVar1;
  undefined1 in_DL;
  undefined1 in_SIL;
  string *in_RDI;
  InternalException *unaff_retaddr;
  allocator local_31;
  string local_30 [30];
  char in_stack_ffffffffffffffee;
  char in_stack_ffffffffffffffef;
  undefined6 in_stack_fffffffffffffff0;
  
  uVar1 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_30,"Information loss on integer cast: value %d outside of target range [%d, %d]",
             &local_31);
  InternalException::InternalException<unsigned_long,_char,_char>
            (unaff_retaddr,in_RDI,CONCAT17(in_SIL,CONCAT16(in_DL,in_stack_fffffffffffffff0)),
             in_stack_ffffffffffffffef,in_stack_ffffffffffffffee);
  __cxa_throw(uVar1,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

static void ThrowNumericCastError(FROM in, TO minval, TO maxval) {
	throw InternalException("Information loss on integer cast: value %d outside of target range [%d, %d]", in, minval,
	                        maxval);
}